

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

char * current_line(void)

{
  char *p;
  char *local_8;
  
  sprintf(current_line::buf,"at line %d in file %s:\\n%s",(ulong)(linenum - 1),finname,
          (long)(int)(uint)(whichbuf == 0) * 0x2000 + 0x144f5e);
  for (local_8 = current_line::buf; *local_8 != '\0'; local_8 = local_8 + 1) {
    if (*local_8 == '\n') {
      *local_8 = '\0';
    }
    if (*local_8 == '\"') {
      *local_8 = '\'';
    }
  }
  return current_line::buf;
}

Assistant:

char* current_line() { /* assumes we actually want the previous line */
	static char buf[NRN_BUFSIZE];
	char* p;
	sprintf(buf,"at line %d in file %s:\\n%s", linenum-1, finname,
		inlinebuf[whichbuf?0:1]+30);
	for (p = buf; *p; ++p) {
		if (*p == '\n') {
			*p = '\0';
		}
		if (*p == '"') {
			*p = '\047';
		}
	}
	return buf;
}